

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_tet_quality(REF_GRID ref_grid,REF_DBL min_quality,char *filename)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_STATUS RVar2;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *f;
  char *zonetype;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_44;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DICT ref_dict;
  char *filename_local;
  REF_DBL min_quality_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_dict = (REF_DICT)filename;
  filename_local = (char *)min_quality;
  min_quality_local = (REF_DBL)ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&ref_node);
  if (uVar1 == 0) {
    ref_cell_00 = *(REF_CELL *)((long)min_quality_local + 0x50);
    for (local_44 = 0; local_44 < ref_cell_00->max; local_44 = local_44 + 1) {
      RVar2 = ref_cell_nodes(ref_cell_00,local_44,(REF_INT *)&quality);
      if (RVar2 == 0) {
        uVar1 = ref_node_tet_quality(ref_node_00,(REF_INT *)&quality,(REF_DBL *)&zonetype);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x22d,"ref_clump_tet_quality",(ulong)uVar1,"qual");
          return uVar1;
        }
        if (((double)zonetype < (double)filename_local) &&
           (uVar1 = ref_dict_store((REF_DICT)ref_node,local_44,0), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x22e,"ref_clump_tet_quality",(ulong)uVar1,"store");
          return uVar1;
        }
      }
    }
    __stream = fopen((char *)ref_dict,"w");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",ref_dict);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x233
             ,"ref_clump_tet_quality","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else {
      fprintf(__stream,"title=\"tecplot refine cell clump file\"\n");
      fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
      uVar1 = ref_clump_cell_zone((FILE *)__stream,ref_cell_00,(REF_DICT)ref_node,"fetetrahedron",
                                  ref_node_00);
      if (uVar1 == 0) {
        fclose(__stream);
        ref_grid_local._4_4_ = ref_dict_free((REF_DICT)ref_node);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x23d,"ref_clump_tet_quality",(ulong)ref_grid_local._4_4_,"free tet");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x239,"ref_clump_tet_quality",(ulong)uVar1,"zone");
        ref_grid_local._4_4_ = uVar1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x229,
           "ref_clump_tet_quality",(ulong)uVar1,"create cell dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tet_quality(REF_GRID ref_grid, REF_DBL min_quality,
                                         const char *filename) {
  REF_DICT ref_dict;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality;
  const char *zonetype;
  FILE *f;

  RSS(ref_dict_create(&ref_dict), "create cell dict");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < min_quality) RSS(ref_dict_store(ref_dict, cell, 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cell clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  zonetype = "fetetrahedron";
  RSS(ref_clump_cell_zone(f, ref_cell, ref_dict, zonetype, ref_node), "zone");

  fclose(f);

  RSS(ref_dict_free(ref_dict), "free tet");

  return REF_SUCCESS;
}